

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

string * __thiscall
despot::ChainState::text_abi_cxx11_(string *__return_storage_ptr__,ChainState *this)

{
  long lVar1;
  ostream *poVar2;
  pointer pvVar3;
  int s2;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&oss,this->mdp_state);
  std::endl<char,std::char_traits<char>>(poVar2);
  pvVar3 = (this->mdp_transitions_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)(this->mdp_transitions_).
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18);
      uVar5 = uVar5 + 1) {
    uVar6 = 0;
    while( true ) {
      if ((ulong)(((long)*(pointer *)
                          ((long)&pvVar3[uVar5].
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                  *(long *)&pvVar3[uVar5].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data) / 0x18) <= uVar6) break;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&oss,(int)uVar5);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)uVar6);
      std::operator<<(poVar2," ->");
      lVar7 = uVar6 * 0x18;
      for (uVar4 = 0;
          lVar1 = *(long *)&(this->mdp_transitions_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar5].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data,
          uVar4 < (ulong)(*(long *)(lVar1 + 8 + lVar7) - *(long *)(lVar1 + lVar7) >> 3);
          uVar4 = uVar4 + 1) {
        std::operator<<((ostream *)&oss," ");
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)(*(long *)&(this->mdp_transitions_).
                                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data + lVar7) + uVar4 * 8));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&oss);
      uVar6 = uVar6 + 1;
      pvVar3 = (this->mdp_transitions_).
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

string ChainState::text() const {
	ostringstream oss;
	oss << mdp_state << endl;
	for (int s1 = 0; s1 < mdp_transitions_.size(); s1++) {
		for (int a = 0; a < mdp_transitions_[s1].size(); a++) {
			oss << s1 << " " << a << " ->";
			for (int s2 = 0; s2 < mdp_transitions_[s1][a].size(); s2++)
				oss << " " << mdp_transitions_[s1][a][s2];
			oss << endl;
		}
	}
	return oss.str();
}